

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::(anonymous_namespace)::DynamicMessageTest_Arena_Test::
~DynamicMessageTest_Arena_Test(DynamicMessageTest_Arena_Test *this)

{
  *(undefined ***)(this + -0x10) = &PTR__DynamicMessageTest_0188d858;
  *(undefined ***)this = &PTR__DynamicMessageTest_0188d898;
  DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)(this + 0x80));
  DescriptorPool::~DescriptorPool((DescriptorPool *)(this + 8));
  testing::Test::~Test((Test *)(this + -0x10));
  operator_delete((Test *)(this + -0x10),0x130);
  return;
}

Assistant:

TEST_P(DynamicMessageTest, Arena) {
  Arena arena;
  Message* message = prototype_->New(&arena);
  Message* extension_message = extensions_prototype_->New(&arena);
  Message* packed_message = packed_prototype_->New(&arena);
  Message* oneof_message = oneof_prototype_->New(&arena);

  // avoid unused-variable error.
  (void)message;
  (void)extension_message;
  (void)packed_message;
  (void)oneof_message;
  // Return without freeing: should not leak.
}